

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  BBox1f BVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  ulong *puVar29;
  int iVar30;
  AABBNodeMB4D *node1;
  ulong uVar31;
  long lVar32;
  long lVar33;
  uint uVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  undefined4 uVar38;
  ulong uVar39;
  Geometry *pGVar40;
  undefined1 auVar41 [8];
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  float fVar46;
  vint4 ai;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  float fVar58;
  float fVar66;
  float fVar67;
  vint4 ai_6;
  undefined1 auVar59 [16];
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar61 [32];
  undefined1 auVar60 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar68;
  undefined1 auVar65 [32];
  vint4 bi;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  vint4 ai_1;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  vint4 bi_1;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  vint4 bi_7;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  float fVar116;
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar110 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar125;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar123;
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar122 [64];
  float fVar129;
  float fVar134;
  float fVar136;
  float fVar138;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar132 [32];
  float fVar135;
  float fVar137;
  float fVar139;
  undefined1 auVar133 [32];
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  float fVar154;
  float fVar158;
  float fVar159;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar160;
  float fVar161;
  float fVar164;
  float fVar165;
  undefined1 auVar162 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar163 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  float old_t;
  vint4 bi_5;
  vint4 bi_2;
  RTCFilterFunctionNArguments args;
  vint<8> itime;
  vfloat<8> ftime;
  NodeRef stack [244];
  undefined1 local_e61;
  ulong *local_e60;
  size_t local_e58;
  RayK<8> *local_e50;
  uint local_e48;
  uint local_e44;
  undefined1 local_e40 [8];
  float fStack_e38;
  float fStack_e34;
  undefined1 local_e20 [32];
  ulong local_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  long local_db8;
  ulong local_db0;
  ulong local_da8;
  long local_da0;
  long local_d98;
  ulong *local_d90;
  ulong local_d88;
  long local_d80;
  long local_d78;
  Scene *local_d70;
  ulong local_d68;
  Geometry *local_d60;
  undefined1 auStack_d58 [24];
  undefined1 local_d40 [32];
  undefined1 local_d20 [32];
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  undefined1 local_cb0 [16];
  undefined1 local_ca0 [16];
  undefined1 local_c90 [16];
  undefined1 local_c80 [16];
  float local_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  float local_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  float local_c30;
  float fStack_c2c;
  float fStack_c28;
  float fStack_c24;
  undefined1 local_c20 [16];
  RTCFilterFunctionNArguments local_c10;
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 *local_a20;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  float local_980 [4];
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined4 uStack_964;
  float local_960 [4];
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar38 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_ca0._4_4_ = uVar38;
  local_ca0._0_4_ = uVar38;
  local_ca0._8_4_ = uVar38;
  local_ca0._12_4_ = uVar38;
  auVar101 = ZEXT1664(local_ca0);
  uVar38 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_cb0._4_4_ = uVar38;
  local_cb0._0_4_ = uVar38;
  local_cb0._8_4_ = uVar38;
  local_cb0._12_4_ = uVar38;
  auVar108 = ZEXT1664(local_cb0);
  uVar38 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_c20._4_4_ = uVar38;
  local_c20._0_4_ = uVar38;
  local_c20._8_4_ = uVar38;
  local_c20._12_4_ = uVar38;
  auVar122 = ZEXT1664(local_c20);
  fVar46 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar58 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar66 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar67 = fVar46 * 0.99999964;
  fVar68 = fVar58 * 0.99999964;
  fVar69 = fVar66 * 0.99999964;
  fVar46 = fVar46 * 1.0000004;
  fVar58 = fVar58 * 1.0000004;
  fVar66 = fVar66 * 1.0000004;
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_d68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar45 = uVar42 ^ 0x10;
  uVar43 = local_d68 ^ 0x10;
  iVar30 = (tray->tnear).field_0.i[k];
  local_c80._4_4_ = iVar30;
  local_c80._0_4_ = iVar30;
  local_c80._8_4_ = iVar30;
  local_c80._12_4_ = iVar30;
  auVar172 = ZEXT1664(local_c80);
  iVar30 = (tray->tfar).field_0.i[k];
  local_c90._4_4_ = iVar30;
  local_c90._0_4_ = iVar30;
  local_c90._8_4_ = iVar30;
  local_c90._12_4_ = iVar30;
  auVar176 = ZEXT1664(local_c90);
  local_b00._16_16_ = mm_lookupmask_ps._240_16_;
  local_b00._0_16_ = mm_lookupmask_ps._0_16_;
  iVar30 = 1 << ((uint)k & 0x1f);
  auVar52._4_4_ = iVar30;
  auVar52._0_4_ = iVar30;
  auVar52._8_4_ = iVar30;
  auVar52._12_4_ = iVar30;
  auVar52._16_4_ = iVar30;
  auVar52._20_4_ = iVar30;
  auVar52._24_4_ = iVar30;
  auVar52._28_4_ = iVar30;
  auVar53 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar52 = vpand_avx2(auVar52,auVar53);
  local_b60 = vpcmpeqd_avx2(auVar52,auVar53);
  auVar61._8_4_ = 0x3f800000;
  auVar61._0_8_ = 0x3f8000003f800000;
  auVar61._12_4_ = 0x3f800000;
  auVar61._16_4_ = 0x3f800000;
  auVar61._20_4_ = 0x3f800000;
  auVar61._24_4_ = 0x3f800000;
  auVar61._28_4_ = 0x3f800000;
  auVar53._8_4_ = 0xbf800000;
  auVar53._0_8_ = 0xbf800000bf800000;
  auVar53._12_4_ = 0xbf800000;
  auVar53._16_4_ = 0xbf800000;
  auVar53._20_4_ = 0xbf800000;
  auVar53._24_4_ = 0xbf800000;
  auVar53._28_4_ = 0xbf800000;
  _local_b20 = vblendvps_avx(auVar61,auVar53,local_b00);
  puVar29 = local_7f8;
  fVar70 = fVar67;
  fVar71 = fVar67;
  fVar116 = fVar67;
  fVar134 = fVar68;
  fVar136 = fVar68;
  fVar138 = fVar68;
  fVar146 = fVar69;
  fVar147 = fVar69;
  fVar148 = fVar69;
  fVar117 = fVar46;
  fVar123 = fVar46;
  fVar124 = fVar46;
  fVar125 = fVar58;
  fVar126 = fVar58;
  fVar127 = fVar58;
  fVar128 = fVar66;
  fVar129 = fVar66;
  fVar135 = fVar66;
  local_e58 = k;
  local_e50 = ray;
  local_da8 = uVar42;
  local_cc0 = fVar67;
  fStack_cbc = fVar67;
  fStack_cb8 = fVar67;
  fStack_cb4 = fVar67;
  local_c70 = fVar66;
  fStack_c6c = fVar66;
  fStack_c68 = fVar66;
  fStack_c64 = fVar66;
  local_c60 = fVar58;
  fStack_c5c = fVar58;
  fStack_c58 = fVar58;
  fStack_c54 = fVar58;
  local_c50 = fVar46;
  fStack_c4c = fVar46;
  fStack_c48 = fVar46;
  fStack_c44 = fVar46;
  local_c40 = fVar69;
  fStack_c3c = fVar69;
  fStack_c38 = fVar69;
  fStack_c34 = fVar69;
  local_c30 = fVar68;
  fStack_c2c = fVar68;
  fStack_c28 = fVar68;
  fStack_c24 = fVar68;
LAB_01627c30:
  do {
    local_d90 = puVar29;
    if (local_d90 == &local_800) {
LAB_01628d8c:
      return local_d90 != &local_800;
    }
    local_e60 = local_d90 + -1;
    uVar44 = local_d90[-1];
    while ((uVar44 & 8) == 0) {
      uVar31 = uVar44 & 0xfffffffffffffff0;
      uVar38 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar47._4_4_ = uVar38;
      auVar47._0_4_ = uVar38;
      auVar47._8_4_ = uVar38;
      auVar47._12_4_ = uVar38;
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar42),auVar47,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + uVar42));
      auVar48 = vsubps_avx(auVar48,auVar101._0_16_);
      auVar59._0_4_ = fVar67 * auVar48._0_4_;
      auVar59._4_4_ = fVar70 * auVar48._4_4_;
      auVar59._8_4_ = fVar71 * auVar48._8_4_;
      auVar59._12_4_ = fVar116 * auVar48._12_4_;
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + local_d68),auVar47,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + local_d68));
      auVar48 = vsubps_avx(auVar48,auVar108._0_16_);
      auVar72._0_4_ = fVar68 * auVar48._0_4_;
      auVar72._4_4_ = fVar134 * auVar48._4_4_;
      auVar72._8_4_ = fVar136 * auVar48._8_4_;
      auVar72._12_4_ = fVar138 * auVar48._12_4_;
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar37),auVar47,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + uVar37));
      auVar48 = vsubps_avx(auVar48,auVar122._0_16_);
      auVar80._0_4_ = fVar69 * auVar48._0_4_;
      auVar80._4_4_ = fVar146 * auVar48._4_4_;
      auVar80._8_4_ = fVar147 * auVar48._8_4_;
      auVar80._12_4_ = fVar148 * auVar48._12_4_;
      auVar48 = vmaxps_avx(auVar72,auVar80);
      auVar59 = vmaxps_avx(auVar172._0_16_,auVar59);
      auVar48 = vmaxps_avx(auVar59,auVar48);
      auVar59 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar45),auVar47,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + uVar45));
      auVar59 = vsubps_avx(auVar59,auVar101._0_16_);
      auVar73._0_4_ = fVar46 * auVar59._0_4_;
      auVar73._4_4_ = fVar117 * auVar59._4_4_;
      auVar73._8_4_ = fVar123 * auVar59._8_4_;
      auVar73._12_4_ = fVar124 * auVar59._12_4_;
      auVar59 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar43),auVar47,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + uVar43));
      auVar59 = vsubps_avx(auVar59,auVar108._0_16_);
      auVar72 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + (uVar37 ^ 0x10)),auVar47,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + (uVar37 ^ 0x10)));
      auVar81._0_4_ = fVar58 * auVar59._0_4_;
      auVar81._4_4_ = fVar125 * auVar59._4_4_;
      auVar81._8_4_ = fVar126 * auVar59._8_4_;
      auVar81._12_4_ = fVar127 * auVar59._12_4_;
      auVar59 = vsubps_avx(auVar72,auVar122._0_16_);
      auVar87._0_4_ = fVar66 * auVar59._0_4_;
      auVar87._4_4_ = fVar128 * auVar59._4_4_;
      auVar87._8_4_ = fVar129 * auVar59._8_4_;
      auVar87._12_4_ = fVar135 * auVar59._12_4_;
      auVar59 = vminps_avx(auVar81,auVar87);
      auVar72 = vminps_avx(auVar176._0_16_,auVar73);
      auVar59 = vminps_avx(auVar72,auVar59);
      if (((uint)uVar44 & 7) == 6) {
        auVar59 = vcmpps_avx(auVar48,auVar59,2);
        auVar48 = vcmpps_avx(*(undefined1 (*) [16])(uVar31 + 0xe0),auVar47,2);
        auVar72 = vcmpps_avx(auVar47,*(undefined1 (*) [16])(uVar31 + 0xf0),1);
        auVar48 = vandps_avx(auVar48,auVar72);
        auVar48 = vandps_avx(auVar48,auVar59);
      }
      else {
        auVar48 = vcmpps_avx(auVar48,auVar59,2);
      }
      auVar48 = vpslld_avx(auVar48,0x1f);
      uVar34 = vmovmskps_avx(auVar48);
      puVar29 = local_e60;
      if (uVar34 == 0) goto LAB_01627c30;
      bvh = (BVH *)0x0;
      for (uVar44 = (ulong)(byte)uVar34; (uVar44 & 1) == 0;
          uVar44 = uVar44 >> 1 | 0x8000000000000000) {
        bvh = (BVH *)((long)&(bvh->super_AccelData).super_RefCount._vptr_RefCount + 1);
      }
      uVar44 = *(ulong *)(uVar31 + (long)bvh * 8);
      uVar34 = (uVar34 & 0xff) - 1 & uVar34 & 0xff;
      uVar39 = (ulong)uVar34;
      if (uVar34 != 0) {
        do {
          *local_e60 = uVar44;
          local_e60 = local_e60 + 1;
          lVar13 = 0;
          for (uVar44 = uVar39; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
            lVar13 = lVar13 + 1;
          }
          uVar39 = uVar39 - 1 & uVar39;
          uVar44 = *(ulong *)(uVar31 + lVar13 * 8);
        } while (uVar39 != 0);
      }
    }
    local_db8 = (ulong)((uint)uVar44 & 0xf) - 8;
    uVar44 = uVar44 & 0xfffffffffffffff0;
    for (local_d98 = 0; puVar29 = local_e60, local_d98 != local_db8; local_d98 = local_d98 + 1) {
      local_da0 = local_d98 * 0x90;
      uVar31 = *(ulong *)(uVar44 + 0x20 + local_da0);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar31;
      auVar48 = vpmovzxbd_avx(auVar49);
      auVar48 = vcvtdq2ps_avx(auVar48);
      uVar38 = *(undefined4 *)(uVar44 + 0x44 + local_da0);
      auVar95._4_4_ = uVar38;
      auVar95._0_4_ = uVar38;
      auVar95._8_4_ = uVar38;
      auVar95._12_4_ = uVar38;
      uVar38 = *(undefined4 *)(uVar44 + 0x38 + local_da0);
      auVar102._4_4_ = uVar38;
      auVar102._0_4_ = uVar38;
      auVar102._8_4_ = uVar38;
      auVar102._12_4_ = uVar38;
      auVar72 = vfmadd213ps_fma(auVar48,auVar95,auVar102);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = *(ulong *)(uVar44 + 0x50 + local_da0);
      auVar48 = vpmovzxbd_avx(auVar48);
      auVar48 = vcvtdq2ps_avx(auVar48);
      uVar38 = *(undefined4 *)(uVar44 + 0x74 + local_da0);
      auVar109._4_4_ = uVar38;
      auVar109._0_4_ = uVar38;
      auVar109._8_4_ = uVar38;
      auVar109._12_4_ = uVar38;
      uVar38 = *(undefined4 *)(uVar44 + 0x68 + local_da0);
      auVar118._4_4_ = uVar38;
      auVar118._0_4_ = uVar38;
      auVar118._8_4_ = uVar38;
      auVar118._12_4_ = uVar38;
      auVar47 = vfmadd213ps_fma(auVar48,auVar109,auVar118);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = *(ulong *)(uVar44 + 0x24 + local_da0);
      auVar48 = vpmovzxbd_avx(auVar60);
      auVar48 = vcvtdq2ps_avx(auVar48);
      auVar73 = vfmadd213ps_fma(auVar48,auVar95,auVar102);
      auVar96._8_8_ = 0;
      auVar96._0_8_ = *(ulong *)(uVar44 + 0x54 + local_da0);
      auVar48 = vpmovzxbd_avx(auVar96);
      auVar48 = vcvtdq2ps_avx(auVar48);
      auVar80 = vfmadd213ps_fma(auVar48,auVar109,auVar118);
      auVar103._8_8_ = 0;
      auVar103._0_8_ = *(ulong *)(uVar44 + 0x28 + local_da0);
      auVar48 = vpmovzxbd_avx(auVar103);
      auVar48 = vcvtdq2ps_avx(auVar48);
      uVar38 = *(undefined4 *)(uVar44 + 0x48 + local_da0);
      auVar130._4_4_ = uVar38;
      auVar130._0_4_ = uVar38;
      auVar130._8_4_ = uVar38;
      auVar130._12_4_ = uVar38;
      uVar38 = *(undefined4 *)(uVar44 + 0x3c + local_da0);
      auVar143._4_4_ = uVar38;
      auVar143._0_4_ = uVar38;
      auVar143._8_4_ = uVar38;
      auVar143._12_4_ = uVar38;
      auVar81 = vfmadd213ps_fma(auVar48,auVar130,auVar143);
      auVar110._8_8_ = 0;
      auVar110._0_8_ = *(ulong *)(uVar44 + 0x58 + local_da0);
      auVar48 = vpmovzxbd_avx(auVar110);
      auVar48 = vcvtdq2ps_avx(auVar48);
      uVar38 = *(undefined4 *)(uVar44 + 0x78 + local_da0);
      auVar149._4_4_ = uVar38;
      auVar149._0_4_ = uVar38;
      auVar149._8_4_ = uVar38;
      auVar149._12_4_ = uVar38;
      uVar38 = *(undefined4 *)(uVar44 + 0x6c + local_da0);
      auVar155._4_4_ = uVar38;
      auVar155._0_4_ = uVar38;
      auVar155._8_4_ = uVar38;
      auVar155._12_4_ = uVar38;
      auVar87 = vfmadd213ps_fma(auVar48,auVar149,auVar155);
      auVar119._8_8_ = 0;
      auVar119._0_8_ = *(ulong *)(uVar44 + 0x2c + local_da0);
      auVar48 = vpmovzxbd_avx(auVar119);
      auVar48 = vcvtdq2ps_avx(auVar48);
      auVar50 = vfmadd213ps_fma(auVar48,auVar130,auVar143);
      auVar131._8_8_ = 0;
      auVar131._0_8_ = *(ulong *)(uVar44 + 0x5c + local_da0);
      auVar48 = vpmovzxbd_avx(auVar131);
      auVar48 = vcvtdq2ps_avx(auVar48);
      auVar74 = vfmadd213ps_fma(auVar48,auVar149,auVar155);
      auVar144._8_8_ = 0;
      auVar144._0_8_ = *(ulong *)(uVar44 + 0x30 + local_da0);
      auVar48 = vpmovzxbd_avx(auVar144);
      auVar48 = vcvtdq2ps_avx(auVar48);
      uVar38 = *(undefined4 *)(uVar44 + 0x4c + local_da0);
      auVar150._4_4_ = uVar38;
      auVar150._0_4_ = uVar38;
      auVar150._8_4_ = uVar38;
      auVar150._12_4_ = uVar38;
      uVar38 = *(undefined4 *)(uVar44 + 0x40 + local_da0);
      auVar156._4_4_ = uVar38;
      auVar156._0_4_ = uVar38;
      auVar156._8_4_ = uVar38;
      auVar156._12_4_ = uVar38;
      auVar82 = vfmadd213ps_fma(auVar48,auVar150,auVar156);
      auVar162._8_8_ = 0;
      auVar162._0_8_ = *(ulong *)(uVar44 + 0x60 + local_da0);
      auVar48 = vpmovzxbd_avx(auVar162);
      auVar48 = vcvtdq2ps_avx(auVar48);
      uVar38 = *(undefined4 *)(uVar44 + 0x7c + local_da0);
      auVar170._4_4_ = uVar38;
      auVar170._0_4_ = uVar38;
      auVar170._8_4_ = uVar38;
      auVar170._12_4_ = uVar38;
      auVar173._8_8_ = 0;
      auVar173._0_8_ = *(ulong *)(uVar44 + 0x34 + local_da0);
      auVar59 = vpmovzxbd_avx(auVar173);
      auVar59 = vcvtdq2ps_avx(auVar59);
      auVar59 = vfmadd213ps_fma(auVar59,auVar150,auVar156);
      uVar38 = *(undefined4 *)(uVar44 + 0x70 + local_da0);
      auVar151._4_4_ = uVar38;
      auVar151._0_4_ = uVar38;
      auVar151._8_4_ = uVar38;
      auVar151._12_4_ = uVar38;
      auVar88 = vfmadd213ps_fma(auVar48,auVar170,auVar151);
      auVar157._8_8_ = 0;
      auVar157._0_8_ = *(ulong *)(uVar44 + 100 + local_da0);
      auVar48 = vpmovzxbd_avx(auVar157);
      auVar48 = vcvtdq2ps_avx(auVar48);
      auVar89 = vfmadd213ps_fma(auVar48,auVar170,auVar151);
      fVar46 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(uVar44 + 0x80 + local_da0)) *
               *(float *)(uVar44 + 0x84 + local_da0);
      auVar152._4_4_ = fVar46;
      auVar152._0_4_ = fVar46;
      auVar152._8_4_ = fVar46;
      auVar152._12_4_ = fVar46;
      auVar48 = vsubps_avx(auVar47,auVar72);
      auVar72 = vfmadd213ps_fma(auVar48,auVar152,auVar72);
      auVar48 = vsubps_avx(auVar80,auVar73);
      auVar47 = vfmadd213ps_fma(auVar48,auVar152,auVar73);
      auVar48 = vsubps_avx(auVar87,auVar81);
      auVar73 = vfmadd213ps_fma(auVar48,auVar152,auVar81);
      auVar48 = vsubps_avx(auVar74,auVar50);
      auVar80 = vfmadd213ps_fma(auVar48,auVar152,auVar50);
      auVar48 = vsubps_avx(auVar88,auVar82);
      auVar81 = vfmadd213ps_fma(auVar48,auVar152,auVar82);
      auVar48 = vsubps_avx(auVar89,auVar59);
      auVar87 = vfmadd213ps_fma(auVar48,auVar152,auVar59);
      auVar48 = vpminub_avx(auVar49,auVar60);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar31;
      auVar48 = vpcmpeqb_avx(auVar50,auVar48);
      auVar59 = vsubps_avx(auVar72,local_ca0);
      local_e40._4_4_ = auVar59._4_4_ * fStack_cbc;
      local_e40._0_4_ = auVar59._0_4_ * local_cc0;
      fStack_e38 = auVar59._8_4_ * fStack_cb8;
      fStack_e34 = auVar59._12_4_ * fStack_cb4;
      auVar59 = vsubps_avx(auVar73,local_cb0);
      auVar82._0_4_ = local_c30 * auVar59._0_4_;
      auVar82._4_4_ = fStack_c2c * auVar59._4_4_;
      auVar82._8_4_ = fStack_c28 * auVar59._8_4_;
      auVar82._12_4_ = fStack_c24 * auVar59._12_4_;
      auVar59 = vsubps_avx(auVar47,local_ca0);
      auVar74._0_4_ = local_c50 * auVar59._0_4_;
      auVar74._4_4_ = fStack_c4c * auVar59._4_4_;
      auVar74._8_4_ = fStack_c48 * auVar59._8_4_;
      auVar74._12_4_ = fStack_c44 * auVar59._12_4_;
      auVar59 = vsubps_avx(auVar80,local_cb0);
      auVar88._0_4_ = local_c60 * auVar59._0_4_;
      auVar88._4_4_ = fStack_c5c * auVar59._4_4_;
      auVar88._8_4_ = fStack_c58 * auVar59._8_4_;
      auVar88._12_4_ = fStack_c54 * auVar59._12_4_;
      auVar72 = vpminsd_avx(_local_e40,auVar74);
      auVar59 = vpmaxsd_avx(_local_e40,auVar74);
      auVar47 = vpminsd_avx(auVar82,auVar88);
      auVar72 = vpmaxsd_avx(auVar72,auVar47);
      auVar47 = vpmaxsd_avx(auVar82,auVar88);
      auVar73 = vsubps_avx(auVar81,local_c20);
      auVar89._0_4_ = local_c40 * auVar73._0_4_;
      auVar89._4_4_ = fStack_c3c * auVar73._4_4_;
      auVar89._8_4_ = fStack_c38 * auVar73._8_4_;
      auVar89._12_4_ = fStack_c34 * auVar73._12_4_;
      auVar73 = vsubps_avx(auVar87,local_c20);
      auVar97._0_4_ = local_c70 * auVar73._0_4_;
      auVar97._4_4_ = fStack_c6c * auVar73._4_4_;
      auVar97._8_4_ = fStack_c68 * auVar73._8_4_;
      auVar97._12_4_ = fStack_c64 * auVar73._12_4_;
      auVar73 = vpminsd_avx(auVar59,auVar47);
      auVar47 = vpminsd_avx(auVar89,auVar97);
      auVar59 = vpmaxsd_avx(auVar89,auVar97);
      auVar47 = vpmaxsd_avx(auVar47,local_c80);
      auVar72 = vpmaxsd_avx(auVar72,auVar47);
      auVar59 = vpminsd_avx(auVar59,local_c90);
      auVar59 = vpminsd_avx(auVar73,auVar59);
      auVar59 = vpcmpgtd_avx(auVar72,auVar59);
      local_e20._0_4_ = auVar48._0_4_;
      auVar48 = vpmovsxbd_avx(ZEXT416((uint)local_e20._0_4_));
      auVar48 = vpandn_avx(auVar59,auVar48);
      uVar38 = vmovmskps_avx(auVar48);
      local_d88 = CONCAT44((int)((ulong)bvh >> 0x20),uVar38);
      local_da0 = uVar44 + local_da0;
      while( true ) {
        auVar176 = ZEXT1664(local_c90);
        auVar172 = ZEXT1664(local_c80);
        auVar122 = ZEXT1664(local_c20);
        if (local_d88 == 0) break;
        lVar13 = 0;
        for (uVar42 = local_d88; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
          lVar13 = lVar13 + 1;
        }
        uVar2 = *(ushort *)(local_da0 + lVar13 * 8);
        uVar3 = *(ushort *)(local_da0 + 2 + lVar13 * 8);
        local_de0._4_4_ = *(uint *)(local_da0 + 0x88);
        local_de8 = (ulong)local_de0._4_4_;
        uVar34 = *(uint *)(local_da0 + 4 + lVar13 * 8);
        local_db0 = (ulong)uVar34;
        local_d70 = context->scene;
        pGVar40 = (local_d70->geometries).items[local_de8].ptr;
        local_d78 = *(long *)&pGVar40->field_0x58;
        BVar1 = pGVar40->time_range;
        auVar51._8_8_ = 0;
        auVar51._0_4_ = BVar1.lower;
        auVar51._4_4_ = BVar1.upper;
        fVar46 = BVar1.lower;
        auVar62._4_4_ = fVar46;
        auVar62._0_4_ = fVar46;
        auVar62._8_4_ = fVar46;
        auVar62._12_4_ = fVar46;
        auVar62._16_4_ = fVar46;
        auVar62._20_4_ = fVar46;
        auVar62._24_4_ = fVar46;
        auVar62._28_4_ = fVar46;
        fVar46 = pGVar40->fnumTimeSegments;
        auVar52 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar62);
        auVar48 = vmovshdup_avx(auVar51);
        auVar48 = vsubps_avx(auVar48,auVar51);
        auVar54._0_4_ = auVar48._0_4_;
        auVar54._4_4_ = auVar54._0_4_;
        auVar54._8_4_ = auVar54._0_4_;
        auVar54._12_4_ = auVar54._0_4_;
        auVar54._16_4_ = auVar54._0_4_;
        auVar54._20_4_ = auVar54._0_4_;
        auVar54._24_4_ = auVar54._0_4_;
        auVar54._28_4_ = auVar54._0_4_;
        auVar52 = vdivps_avx(auVar52,auVar54);
        local_d80 = pGVar40[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                    local_db0;
        auVar12._4_4_ = fVar46 * auVar52._4_4_;
        auVar12._0_4_ = fVar46 * auVar52._0_4_;
        auVar12._8_4_ = fVar46 * auVar52._8_4_;
        auVar12._12_4_ = fVar46 * auVar52._12_4_;
        auVar12._16_4_ = fVar46 * auVar52._16_4_;
        auVar12._20_4_ = fVar46 * auVar52._20_4_;
        auVar12._24_4_ = fVar46 * auVar52._24_4_;
        auVar12._28_4_ = auVar52._28_4_;
        auVar52 = vroundps_avx(auVar12,1);
        fVar46 = fVar46 + -1.0;
        auVar75._4_4_ = fVar46;
        auVar75._0_4_ = fVar46;
        auVar75._8_4_ = fVar46;
        auVar75._12_4_ = fVar46;
        auVar75._16_4_ = fVar46;
        auVar75._20_4_ = fVar46;
        auVar75._24_4_ = fVar46;
        auVar75._28_4_ = fVar46;
        auVar52 = vminps_avx(auVar52,auVar75);
        auVar52 = vmaxps_avx(auVar52,_DAT_01f7b000);
        local_aa0 = vsubps_avx(auVar12,auVar52);
        local_ac0 = vcvtps2dq_avx(auVar52);
        local_e44 = uVar2 & 0x7fff;
        local_e48 = uVar3 & 0x7fff;
        uVar4 = *(uint *)(local_d78 + 4 + local_d80);
        uVar31 = (ulong)uVar4;
        uVar39 = (ulong)(uVar4 * local_e48 + *(int *)(local_d78 + local_d80) + local_e44);
        lVar5 = *(long *)&pGVar40[2].numPrimitives;
        lVar35 = (long)*(int *)(local_ac0 + k * 4) * 0x38;
        lVar6 = *(long *)(lVar5 + 0x10 + lVar35);
        lVar7 = *(long *)(lVar5 + lVar35);
        auVar48 = *(undefined1 (*) [16])(lVar7 + lVar6 * uVar39);
        lVar8 = *(long *)(lVar5 + 0x48 + lVar35);
        auVar59 = *(undefined1 (*) [16])(lVar7 + (uVar39 + 1) * lVar6);
        lVar13 = uVar39 + uVar31;
        auVar72 = *(undefined1 (*) [16])(lVar7 + lVar13 * lVar6);
        lVar36 = uVar39 + uVar31 + 1;
        auVar73 = *(undefined1 (*) [16])(lVar7 + lVar36 * lVar6);
        lVar32 = uVar39 + (-1 < (short)uVar2) + 1;
        auVar47 = *(undefined1 (*) [16])(lVar7 + lVar32 * lVar6);
        lVar33 = (ulong)(-1 < (short)uVar2) + lVar36;
        auVar80 = *(undefined1 (*) [16])(lVar7 + lVar33 * lVar6);
        uVar42 = 0;
        if (-1 < (short)uVar3) {
          uVar42 = uVar31;
        }
        auVar81 = *(undefined1 (*) [16])(lVar7 + (lVar13 + uVar42) * lVar6);
        auVar87 = *(undefined1 (*) [16])(lVar7 + (lVar36 + uVar42) * lVar6);
        auVar50 = *(undefined1 (*) [16])(lVar7 + lVar6 * (uVar42 + lVar33));
        lVar5 = *(long *)(lVar5 + 0x38 + lVar35);
        uVar38 = *(undefined4 *)(local_aa0 + local_e58 * 4);
        auVar174._4_4_ = uVar38;
        auVar174._0_4_ = uVar38;
        auVar174._8_4_ = uVar38;
        auVar174._12_4_ = uVar38;
        auVar74 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * uVar39),auVar48);
        auVar74 = vfmadd213ps_fma(auVar74,auVar174,auVar48);
        auVar48 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * (uVar39 + 1)),auVar59);
        auVar82 = vfmadd213ps_fma(auVar48,auVar174,auVar59);
        auVar48 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar13),auVar72);
        auVar88 = vfmadd213ps_fma(auVar48,auVar174,auVar72);
        auVar48 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar36),auVar73);
        auVar89 = vfmadd213ps_fma(auVar48,auVar174,auVar73);
        auVar48 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar32),auVar47);
        auVar59 = vfmadd213ps_fma(auVar48,auVar174,auVar47);
        auVar48 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar33),auVar80);
        auVar49 = vfmadd213ps_fma(auVar48,auVar174,auVar80);
        auVar48 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * (lVar13 + uVar42)),auVar81);
        auVar60 = vfmadd213ps_fma(auVar48,auVar174,auVar81);
        auVar48 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * (lVar36 + uVar42)),auVar87);
        auVar95 = vfmadd213ps_fma(auVar48,auVar174,auVar87);
        auVar48 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + (uVar42 + lVar33) * lVar8),auVar50);
        auVar50 = vfmadd213ps_fma(auVar48,auVar174,auVar50);
        auVar72 = vunpcklps_avx(auVar82,auVar49);
        auVar48 = vunpckhps_avx(auVar82,auVar49);
        auVar47 = vunpcklps_avx(auVar59,auVar89);
        auVar59 = vunpckhps_avx(auVar59,auVar89);
        auVar73 = vunpcklps_avx(auVar48,auVar59);
        auVar80 = vunpcklps_avx(auVar72,auVar47);
        auVar48 = vunpckhps_avx(auVar72,auVar47);
        auVar47 = vunpcklps_avx(auVar88,auVar95);
        auVar59 = vunpckhps_avx(auVar88,auVar95);
        auVar81 = vunpcklps_avx(auVar89,auVar60);
        auVar72 = vunpckhps_avx(auVar89,auVar60);
        auVar72 = vunpcklps_avx(auVar59,auVar72);
        auVar87 = vunpcklps_avx(auVar47,auVar81);
        auVar59 = vunpckhps_avx(auVar47,auVar81);
        auVar99._16_16_ = auVar95;
        auVar99._0_16_ = auVar88;
        auVar55._16_16_ = auVar49;
        auVar55._0_16_ = auVar82;
        auVar52 = vunpcklps_avx(auVar55,auVar99);
        auVar112._16_16_ = auVar89;
        auVar112._0_16_ = auVar74;
        auVar63._16_16_ = auVar50;
        auVar63._0_16_ = auVar89;
        auVar53 = vunpcklps_avx(auVar112,auVar63);
        auVar12 = vunpcklps_avx(auVar53,auVar52);
        auVar52 = vunpckhps_avx(auVar53,auVar52);
        auVar53 = vunpckhps_avx(auVar55,auVar99);
        auVar61 = vunpckhps_avx(auVar112,auVar63);
        auVar53 = vunpcklps_avx(auVar61,auVar53);
        auVar64._16_16_ = auVar80;
        auVar64._0_16_ = auVar80;
        auVar90._16_16_ = auVar48;
        auVar90._0_16_ = auVar48;
        auVar104._16_16_ = auVar73;
        auVar104._0_16_ = auVar73;
        auVar113._16_16_ = auVar87;
        auVar113._0_16_ = auVar87;
        auVar175._16_16_ = auVar59;
        auVar175._0_16_ = auVar59;
        uVar38 = *(undefined4 *)(local_e50 + local_e58 * 4);
        auVar132._4_4_ = uVar38;
        auVar132._0_4_ = uVar38;
        auVar132._8_4_ = uVar38;
        auVar132._12_4_ = uVar38;
        auVar132._16_4_ = uVar38;
        auVar132._20_4_ = uVar38;
        auVar132._24_4_ = uVar38;
        auVar132._28_4_ = uVar38;
        uVar38 = *(undefined4 *)(local_e50 + local_e58 * 4 + 0x20);
        auVar145._4_4_ = uVar38;
        auVar145._0_4_ = uVar38;
        auVar145._8_4_ = uVar38;
        auVar145._12_4_ = uVar38;
        auVar145._16_4_ = uVar38;
        auVar145._20_4_ = uVar38;
        auVar145._24_4_ = uVar38;
        auVar145._28_4_ = uVar38;
        auVar83._16_16_ = auVar72;
        auVar83._0_16_ = auVar72;
        uVar38 = *(undefined4 *)(local_e50 + local_e58 * 4 + 0x40);
        auVar163._4_4_ = uVar38;
        auVar163._0_4_ = uVar38;
        auVar163._8_4_ = uVar38;
        auVar163._12_4_ = uVar38;
        auVar163._16_4_ = uVar38;
        auVar163._20_4_ = uVar38;
        auVar163._24_4_ = uVar38;
        auVar163._28_4_ = uVar38;
        auVar12 = vsubps_avx(auVar12,auVar132);
        auVar54 = vsubps_avx(auVar52,auVar145);
        auVar62 = vsubps_avx(auVar53,auVar163);
        auVar52 = vsubps_avx(auVar64,auVar132);
        auVar53 = vsubps_avx(auVar90,auVar145);
        auVar61 = vsubps_avx(auVar104,auVar163);
        auVar75 = vsubps_avx(auVar113,auVar132);
        auVar55 = vsubps_avx(auVar175,auVar145);
        auVar153 = vsubps_avx(auVar83,auVar163);
        local_d00 = vsubps_avx(auVar75,auVar12);
        auVar63 = vsubps_avx(auVar55,auVar54);
        local_ba0 = vsubps_avx(auVar153,auVar62);
        auVar56._0_4_ = auVar12._0_4_ + auVar75._0_4_;
        auVar56._4_4_ = auVar12._4_4_ + auVar75._4_4_;
        auVar56._8_4_ = auVar12._8_4_ + auVar75._8_4_;
        auVar56._12_4_ = auVar12._12_4_ + auVar75._12_4_;
        auVar56._16_4_ = auVar12._16_4_ + auVar75._16_4_;
        auVar56._20_4_ = auVar12._20_4_ + auVar75._20_4_;
        auVar56._24_4_ = auVar12._24_4_ + auVar75._24_4_;
        fVar129 = auVar12._28_4_;
        auVar56._28_4_ = fVar129 + auVar75._28_4_;
        auVar76._0_4_ = auVar54._0_4_ + auVar55._0_4_;
        auVar76._4_4_ = auVar54._4_4_ + auVar55._4_4_;
        auVar76._8_4_ = auVar54._8_4_ + auVar55._8_4_;
        auVar76._12_4_ = auVar54._12_4_ + auVar55._12_4_;
        auVar76._16_4_ = auVar54._16_4_ + auVar55._16_4_;
        auVar76._20_4_ = auVar54._20_4_ + auVar55._20_4_;
        auVar76._24_4_ = auVar54._24_4_ + auVar55._24_4_;
        auVar76._28_4_ = auVar54._28_4_ + auVar55._28_4_;
        fVar117 = auVar62._0_4_;
        auVar105._0_4_ = fVar117 + auVar153._0_4_;
        fVar123 = auVar62._4_4_;
        auVar105._4_4_ = fVar123 + auVar153._4_4_;
        fVar124 = auVar62._8_4_;
        auVar105._8_4_ = fVar124 + auVar153._8_4_;
        fVar125 = auVar62._12_4_;
        auVar105._12_4_ = fVar125 + auVar153._12_4_;
        fVar126 = auVar62._16_4_;
        auVar105._16_4_ = fVar126 + auVar153._16_4_;
        fVar127 = auVar62._20_4_;
        auVar105._20_4_ = fVar127 + auVar153._20_4_;
        fVar128 = auVar62._24_4_;
        auVar105._24_4_ = fVar128 + auVar153._24_4_;
        fVar66 = auVar62._28_4_;
        auVar105._28_4_ = fVar66 + auVar153._28_4_;
        auVar10._4_4_ = local_ba0._4_4_ * auVar76._4_4_;
        auVar10._0_4_ = local_ba0._0_4_ * auVar76._0_4_;
        auVar10._8_4_ = local_ba0._8_4_ * auVar76._8_4_;
        auVar10._12_4_ = local_ba0._12_4_ * auVar76._12_4_;
        auVar10._16_4_ = local_ba0._16_4_ * auVar76._16_4_;
        auVar10._20_4_ = local_ba0._20_4_ * auVar76._20_4_;
        auVar10._24_4_ = local_ba0._24_4_ * auVar76._24_4_;
        auVar10._28_4_ = uVar38;
        auVar59 = vfmsub231ps_fma(auVar10,auVar63,auVar105);
        auVar11._4_4_ = local_d00._4_4_ * auVar105._4_4_;
        auVar11._0_4_ = local_d00._0_4_ * auVar105._0_4_;
        auVar11._8_4_ = local_d00._8_4_ * auVar105._8_4_;
        auVar11._12_4_ = local_d00._12_4_ * auVar105._12_4_;
        auVar11._16_4_ = local_d00._16_4_ * auVar105._16_4_;
        auVar11._20_4_ = local_d00._20_4_ * auVar105._20_4_;
        auVar11._24_4_ = local_d00._24_4_ * auVar105._24_4_;
        auVar11._28_4_ = auVar105._28_4_;
        auVar48 = vfmsub231ps_fma(auVar11,local_ba0,auVar56);
        auVar14._4_4_ = auVar63._4_4_ * auVar56._4_4_;
        auVar14._0_4_ = auVar63._0_4_ * auVar56._0_4_;
        auVar14._8_4_ = auVar63._8_4_ * auVar56._8_4_;
        auVar14._12_4_ = auVar63._12_4_ * auVar56._12_4_;
        auVar14._16_4_ = auVar63._16_4_ * auVar56._16_4_;
        auVar14._20_4_ = auVar63._20_4_ * auVar56._20_4_;
        auVar14._24_4_ = auVar63._24_4_ * auVar56._24_4_;
        auVar14._28_4_ = auVar56._28_4_;
        auVar72 = vfmsub231ps_fma(auVar14,local_d00,auVar76);
        uVar38 = *(undefined4 *)(local_e50 + local_e58 * 4 + 0xa0);
        local_e20._4_4_ = uVar38;
        local_e20._0_4_ = uVar38;
        local_e20._8_4_ = uVar38;
        local_e20._12_4_ = uVar38;
        local_e20._16_4_ = uVar38;
        local_e20._20_4_ = uVar38;
        local_e20._24_4_ = uVar38;
        local_e20._28_4_ = uVar38;
        fVar46 = *(float *)(local_e50 + local_e58 * 4 + 0xc0);
        auVar15._4_4_ = fVar46 * auVar72._4_4_;
        auVar15._0_4_ = fVar46 * auVar72._0_4_;
        auVar15._8_4_ = fVar46 * auVar72._8_4_;
        auVar15._12_4_ = fVar46 * auVar72._12_4_;
        auVar15._16_4_ = fVar46 * 0.0;
        auVar15._20_4_ = fVar46 * 0.0;
        auVar15._24_4_ = fVar46 * 0.0;
        auVar15._28_4_ = auVar63._28_4_;
        auVar48 = vfmadd231ps_fma(auVar15,local_e20,ZEXT1632(auVar48));
        uVar38 = *(undefined4 *)(local_e50 + local_e58 * 4 + 0x80);
        local_e40._4_4_ = uVar38;
        local_e40._0_4_ = uVar38;
        fStack_e38 = (float)uVar38;
        fStack_e34 = (float)uVar38;
        register0x00001290 = uVar38;
        register0x00001294 = uVar38;
        register0x00001298 = uVar38;
        register0x0000129c = uVar38;
        auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),_local_e40,ZEXT1632(auVar59));
        local_bc0 = vsubps_avx(auVar54,auVar53);
        local_be0 = vsubps_avx(auVar62,auVar61);
        auVar171._0_4_ = auVar54._0_4_ + auVar53._0_4_;
        auVar171._4_4_ = auVar54._4_4_ + auVar53._4_4_;
        auVar171._8_4_ = auVar54._8_4_ + auVar53._8_4_;
        auVar171._12_4_ = auVar54._12_4_ + auVar53._12_4_;
        auVar171._16_4_ = auVar54._16_4_ + auVar53._16_4_;
        auVar171._20_4_ = auVar54._20_4_ + auVar53._20_4_;
        auVar171._24_4_ = auVar54._24_4_ + auVar53._24_4_;
        auVar171._28_4_ = auVar54._28_4_ + auVar53._28_4_;
        auVar106._0_4_ = fVar117 + auVar61._0_4_;
        auVar106._4_4_ = fVar123 + auVar61._4_4_;
        auVar106._8_4_ = fVar124 + auVar61._8_4_;
        auVar106._12_4_ = fVar125 + auVar61._12_4_;
        auVar106._16_4_ = fVar126 + auVar61._16_4_;
        auVar106._20_4_ = fVar127 + auVar61._20_4_;
        auVar106._24_4_ = fVar128 + auVar61._24_4_;
        auVar106._28_4_ = fVar66 + auVar61._28_4_;
        fVar58 = local_be0._0_4_;
        fVar67 = local_be0._4_4_;
        auVar16._4_4_ = auVar171._4_4_ * fVar67;
        auVar16._0_4_ = auVar171._0_4_ * fVar58;
        fVar69 = local_be0._8_4_;
        auVar16._8_4_ = auVar171._8_4_ * fVar69;
        fVar71 = local_be0._12_4_;
        auVar16._12_4_ = auVar171._12_4_ * fVar71;
        fVar134 = local_be0._16_4_;
        auVar16._16_4_ = auVar171._16_4_ * fVar134;
        fVar138 = local_be0._20_4_;
        auVar16._20_4_ = auVar171._20_4_ * fVar138;
        fVar147 = local_be0._24_4_;
        auVar16._24_4_ = auVar171._24_4_ * fVar147;
        auVar16._28_4_ = fVar66;
        auVar72 = vfmsub231ps_fma(auVar16,local_bc0,auVar106);
        auVar10 = vsubps_avx(auVar12,auVar52);
        fVar66 = auVar10._0_4_;
        fVar68 = auVar10._4_4_;
        auVar17._4_4_ = auVar106._4_4_ * fVar68;
        auVar17._0_4_ = auVar106._0_4_ * fVar66;
        fVar70 = auVar10._8_4_;
        auVar17._8_4_ = auVar106._8_4_ * fVar70;
        fVar116 = auVar10._12_4_;
        auVar17._12_4_ = auVar106._12_4_ * fVar116;
        fVar136 = auVar10._16_4_;
        auVar17._16_4_ = auVar106._16_4_ * fVar136;
        fVar146 = auVar10._20_4_;
        auVar17._20_4_ = auVar106._20_4_ * fVar146;
        fVar148 = auVar10._24_4_;
        auVar17._24_4_ = auVar106._24_4_ * fVar148;
        auVar17._28_4_ = local_d00._28_4_;
        auVar107._0_4_ = auVar12._0_4_ + auVar52._0_4_;
        auVar107._4_4_ = auVar12._4_4_ + auVar52._4_4_;
        auVar107._8_4_ = auVar12._8_4_ + auVar52._8_4_;
        auVar107._12_4_ = auVar12._12_4_ + auVar52._12_4_;
        auVar107._16_4_ = auVar12._16_4_ + auVar52._16_4_;
        auVar107._20_4_ = auVar12._20_4_ + auVar52._20_4_;
        auVar107._24_4_ = auVar12._24_4_ + auVar52._24_4_;
        auVar107._28_4_ = fVar129 + auVar52._28_4_;
        auVar59 = vfmsub231ps_fma(auVar17,local_be0,auVar107);
        fVar161 = local_bc0._0_4_;
        fVar164 = local_bc0._4_4_;
        auVar18._4_4_ = fVar164 * auVar107._4_4_;
        auVar18._0_4_ = fVar161 * auVar107._0_4_;
        fVar165 = local_bc0._8_4_;
        auVar18._8_4_ = fVar165 * auVar107._8_4_;
        fVar166 = local_bc0._12_4_;
        auVar18._12_4_ = fVar166 * auVar107._12_4_;
        fVar167 = local_bc0._16_4_;
        auVar18._16_4_ = fVar167 * auVar107._16_4_;
        fVar168 = local_bc0._20_4_;
        auVar18._20_4_ = fVar168 * auVar107._20_4_;
        fVar169 = local_bc0._24_4_;
        auVar18._24_4_ = fVar169 * auVar107._24_4_;
        auVar18._28_4_ = auVar107._28_4_;
        auVar47 = vfmsub231ps_fma(auVar18,auVar10,auVar171);
        auVar19._4_4_ = fVar46 * auVar47._4_4_;
        auVar19._0_4_ = fVar46 * auVar47._0_4_;
        auVar19._8_4_ = fVar46 * auVar47._8_4_;
        auVar19._12_4_ = fVar46 * auVar47._12_4_;
        auVar19._16_4_ = fVar46 * 0.0;
        auVar19._20_4_ = fVar46 * 0.0;
        auVar19._24_4_ = fVar46 * 0.0;
        auVar19._28_4_ = fVar129;
        auVar59 = vfmadd231ps_fma(auVar19,local_e20,ZEXT1632(auVar59));
        auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),_local_e40,ZEXT1632(auVar72));
        auVar11 = vsubps_avx(auVar52,auVar75);
        auVar91._0_4_ = auVar52._0_4_ + auVar75._0_4_;
        auVar91._4_4_ = auVar52._4_4_ + auVar75._4_4_;
        auVar91._8_4_ = auVar52._8_4_ + auVar75._8_4_;
        auVar91._12_4_ = auVar52._12_4_ + auVar75._12_4_;
        auVar91._16_4_ = auVar52._16_4_ + auVar75._16_4_;
        auVar91._20_4_ = auVar52._20_4_ + auVar75._20_4_;
        auVar91._24_4_ = auVar52._24_4_ + auVar75._24_4_;
        auVar91._28_4_ = auVar52._28_4_ + auVar75._28_4_;
        auVar75 = vsubps_avx(auVar53,auVar55);
        auVar114._0_4_ = auVar53._0_4_ + auVar55._0_4_;
        auVar114._4_4_ = auVar53._4_4_ + auVar55._4_4_;
        auVar114._8_4_ = auVar53._8_4_ + auVar55._8_4_;
        auVar114._12_4_ = auVar53._12_4_ + auVar55._12_4_;
        auVar114._16_4_ = auVar53._16_4_ + auVar55._16_4_;
        auVar114._20_4_ = auVar53._20_4_ + auVar55._20_4_;
        auVar114._24_4_ = auVar53._24_4_ + auVar55._24_4_;
        auVar114._28_4_ = auVar53._28_4_ + auVar55._28_4_;
        auVar55 = vsubps_avx(auVar61,auVar153);
        auVar84._0_4_ = auVar61._0_4_ + auVar153._0_4_;
        auVar84._4_4_ = auVar61._4_4_ + auVar153._4_4_;
        auVar84._8_4_ = auVar61._8_4_ + auVar153._8_4_;
        auVar84._12_4_ = auVar61._12_4_ + auVar153._12_4_;
        auVar84._16_4_ = auVar61._16_4_ + auVar153._16_4_;
        auVar84._20_4_ = auVar61._20_4_ + auVar153._20_4_;
        auVar84._24_4_ = auVar61._24_4_ + auVar153._24_4_;
        auVar84._28_4_ = auVar61._28_4_ + auVar153._28_4_;
        auVar120._0_4_ = auVar114._0_4_ * auVar55._0_4_;
        auVar120._4_4_ = auVar114._4_4_ * auVar55._4_4_;
        auVar120._8_4_ = auVar114._8_4_ * auVar55._8_4_;
        auVar120._12_4_ = auVar114._12_4_ * auVar55._12_4_;
        auVar120._16_4_ = auVar114._16_4_ * auVar55._16_4_;
        auVar120._20_4_ = auVar114._20_4_ * auVar55._20_4_;
        auVar120._24_4_ = auVar114._24_4_ * auVar55._24_4_;
        auVar120._28_4_ = 0;
        auVar47 = vfmsub231ps_fma(auVar120,auVar75,auVar84);
        auVar153._4_4_ = auVar84._4_4_ * auVar11._4_4_;
        auVar153._0_4_ = auVar84._0_4_ * auVar11._0_4_;
        auVar153._8_4_ = auVar84._8_4_ * auVar11._8_4_;
        auVar153._12_4_ = auVar84._12_4_ * auVar11._12_4_;
        auVar153._16_4_ = auVar84._16_4_ * auVar11._16_4_;
        auVar153._20_4_ = auVar84._20_4_ * auVar11._20_4_;
        auVar153._24_4_ = auVar84._24_4_ * auVar11._24_4_;
        auVar153._28_4_ = auVar84._28_4_;
        auVar72 = vfmsub231ps_fma(auVar153,auVar55,auVar91);
        auVar20._4_4_ = auVar91._4_4_ * auVar75._4_4_;
        auVar20._0_4_ = auVar91._0_4_ * auVar75._0_4_;
        auVar20._8_4_ = auVar91._8_4_ * auVar75._8_4_;
        auVar20._12_4_ = auVar91._12_4_ * auVar75._12_4_;
        auVar20._16_4_ = auVar91._16_4_ * auVar75._16_4_;
        auVar20._20_4_ = auVar91._20_4_ * auVar75._20_4_;
        auVar20._24_4_ = auVar91._24_4_ * auVar75._24_4_;
        auVar20._28_4_ = auVar91._28_4_;
        auVar73 = vfmsub231ps_fma(auVar20,auVar11,auVar114);
        auVar92._0_4_ = fVar46 * auVar73._0_4_;
        auVar92._4_4_ = fVar46 * auVar73._4_4_;
        auVar92._8_4_ = fVar46 * auVar73._8_4_;
        auVar92._12_4_ = fVar46 * auVar73._12_4_;
        auVar92._16_4_ = fVar46 * 0.0;
        auVar92._20_4_ = fVar46 * 0.0;
        auVar92._24_4_ = fVar46 * 0.0;
        auVar92._28_4_ = 0;
        auVar72 = vfmadd231ps_fma(auVar92,local_e20,ZEXT1632(auVar72));
        auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),_local_e40,ZEXT1632(auVar47));
        fVar154 = auVar72._0_4_ + auVar48._0_4_ + auVar59._0_4_;
        fVar158 = auVar72._4_4_ + auVar48._4_4_ + auVar59._4_4_;
        fVar159 = auVar72._8_4_ + auVar48._8_4_ + auVar59._8_4_;
        fVar160 = auVar72._12_4_ + auVar48._12_4_ + auVar59._12_4_;
        local_d20 = ZEXT1632(CONCAT412(fVar160,CONCAT48(fVar159,CONCAT44(fVar158,fVar154))));
        auVar85._8_4_ = 0x7fffffff;
        auVar85._0_8_ = 0x7fffffff7fffffff;
        auVar85._12_4_ = 0x7fffffff;
        auVar85._16_4_ = 0x7fffffff;
        auVar85._20_4_ = 0x7fffffff;
        auVar85._24_4_ = 0x7fffffff;
        auVar85._28_4_ = 0x7fffffff;
        local_ae0 = ZEXT1632(auVar48);
        auVar52 = vminps_avx(local_ae0,ZEXT1632(auVar59));
        auVar52 = vminps_avx(auVar52,ZEXT1632(auVar72));
        local_b40 = vandps_avx(local_d20,auVar85);
        fVar129 = local_b40._0_4_ * 1.1920929e-07;
        fVar135 = local_b40._4_4_ * 1.1920929e-07;
        auVar21._4_4_ = fVar135;
        auVar21._0_4_ = fVar129;
        fVar137 = local_b40._8_4_ * 1.1920929e-07;
        auVar21._8_4_ = fVar137;
        fVar139 = local_b40._12_4_ * 1.1920929e-07;
        auVar21._12_4_ = fVar139;
        fVar140 = local_b40._16_4_ * 1.1920929e-07;
        auVar21._16_4_ = fVar140;
        fVar141 = local_b40._20_4_ * 1.1920929e-07;
        auVar21._20_4_ = fVar141;
        fVar142 = local_b40._24_4_ * 1.1920929e-07;
        auVar21._24_4_ = fVar142;
        auVar21._28_4_ = 0x34000000;
        auVar121._0_8_ = CONCAT44(fVar135,fVar129) ^ 0x8000000080000000;
        auVar121._8_4_ = -fVar137;
        auVar121._12_4_ = -fVar139;
        auVar121._16_4_ = -fVar140;
        auVar121._20_4_ = -fVar141;
        auVar121._24_4_ = -fVar142;
        auVar121._28_4_ = 0xb4000000;
        auVar52 = vcmpps_avx(auVar52,auVar121,5);
        auVar153 = ZEXT1632(auVar59);
        auVar61 = vmaxps_avx(local_ae0,auVar153);
        auVar53 = vmaxps_avx(auVar61,ZEXT1632(auVar72));
        auVar53 = vcmpps_avx(auVar53,auVar21,2);
        auVar53 = vorps_avx(auVar52,auVar53);
        k = local_e58;
        ray = local_e50;
        if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar53 >> 0x7f,0) != '\0') ||
              (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar53 >> 0xbf,0) != '\0') ||
            (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar53[0x1f] < '\0') {
          auVar22._4_4_ = local_ba0._4_4_ * fVar164;
          auVar22._0_4_ = local_ba0._0_4_ * fVar161;
          auVar22._8_4_ = local_ba0._8_4_ * fVar165;
          auVar22._12_4_ = local_ba0._12_4_ * fVar166;
          auVar22._16_4_ = local_ba0._16_4_ * fVar167;
          auVar22._20_4_ = local_ba0._20_4_ * fVar168;
          auVar22._24_4_ = local_ba0._24_4_ * fVar169;
          auVar22._28_4_ = auVar52._28_4_;
          auVar23._4_4_ = fVar68 * auVar63._4_4_;
          auVar23._0_4_ = fVar66 * auVar63._0_4_;
          auVar23._8_4_ = fVar70 * auVar63._8_4_;
          auVar23._12_4_ = fVar116 * auVar63._12_4_;
          auVar23._16_4_ = fVar136 * auVar63._16_4_;
          auVar23._20_4_ = fVar146 * auVar63._20_4_;
          auVar23._24_4_ = fVar148 * auVar63._24_4_;
          auVar23._28_4_ = auVar61._28_4_;
          auVar48 = vfmsub213ps_fma(auVar63,local_be0,auVar22);
          auVar24._4_4_ = auVar75._4_4_ * fVar67;
          auVar24._0_4_ = auVar75._0_4_ * fVar58;
          auVar24._8_4_ = auVar75._8_4_ * fVar69;
          auVar24._12_4_ = auVar75._12_4_ * fVar71;
          auVar24._16_4_ = auVar75._16_4_ * fVar134;
          auVar24._20_4_ = auVar75._20_4_ * fVar138;
          auVar24._24_4_ = auVar75._24_4_ * fVar147;
          auVar24._28_4_ = 0x34000000;
          auVar25._4_4_ = fVar68 * auVar55._4_4_;
          auVar25._0_4_ = fVar66 * auVar55._0_4_;
          auVar25._8_4_ = fVar70 * auVar55._8_4_;
          auVar25._12_4_ = fVar116 * auVar55._12_4_;
          auVar25._16_4_ = fVar136 * auVar55._16_4_;
          auVar25._20_4_ = fVar146 * auVar55._20_4_;
          auVar25._24_4_ = fVar148 * auVar55._24_4_;
          auVar25._28_4_ = 0;
          auVar59 = vfmsub213ps_fma(auVar55,local_bc0,auVar24);
          auVar52 = vandps_avx(auVar22,auVar85);
          auVar61 = vandps_avx(auVar24,auVar85);
          auVar52 = vcmpps_avx(auVar52,auVar61,1);
          auVar55 = vblendvps_avx(ZEXT1632(auVar59),ZEXT1632(auVar48),auVar52);
          auVar100._0_4_ = auVar11._0_4_ * fVar161;
          auVar100._4_4_ = auVar11._4_4_ * fVar164;
          auVar100._8_4_ = auVar11._8_4_ * fVar165;
          auVar100._12_4_ = auVar11._12_4_ * fVar166;
          auVar100._16_4_ = auVar11._16_4_ * fVar167;
          auVar100._20_4_ = auVar11._20_4_ * fVar168;
          auVar100._24_4_ = auVar11._24_4_ * fVar169;
          auVar100._28_4_ = 0;
          auVar48 = vfmsub213ps_fma(auVar11,local_be0,auVar25);
          auVar26._4_4_ = local_d00._4_4_ * fVar67;
          auVar26._0_4_ = local_d00._0_4_ * fVar58;
          auVar26._8_4_ = local_d00._8_4_ * fVar69;
          auVar26._12_4_ = local_d00._12_4_ * fVar71;
          auVar26._16_4_ = local_d00._16_4_ * fVar134;
          auVar26._20_4_ = local_d00._20_4_ * fVar138;
          auVar26._24_4_ = local_d00._24_4_ * fVar147;
          auVar26._28_4_ = auVar52._28_4_;
          auVar59 = vfmsub213ps_fma(local_ba0,auVar10,auVar26);
          auVar52 = vandps_avx(auVar26,auVar85);
          auVar61 = vandps_avx(auVar25,auVar85);
          auVar52 = vcmpps_avx(auVar52,auVar61,1);
          auVar63 = vblendvps_avx(ZEXT1632(auVar48),ZEXT1632(auVar59),auVar52);
          auVar48 = vfmsub213ps_fma(local_d00,local_bc0,auVar23);
          auVar59 = vfmsub213ps_fma(auVar75,auVar10,auVar100);
          auVar52 = vandps_avx(auVar23,auVar85);
          auVar61 = vandps_avx(auVar100,auVar85);
          auVar52 = vcmpps_avx(auVar52,auVar61,1);
          auVar52 = vblendvps_avx(ZEXT1632(auVar59),ZEXT1632(auVar48),auVar52);
          auVar48 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
          fVar58 = auVar52._0_4_;
          auVar86._0_4_ = fVar58 * fVar46;
          fVar66 = auVar52._4_4_;
          auVar86._4_4_ = fVar66 * fVar46;
          fVar67 = auVar52._8_4_;
          auVar86._8_4_ = fVar67 * fVar46;
          fVar68 = auVar52._12_4_;
          auVar86._12_4_ = fVar68 * fVar46;
          fVar69 = auVar52._16_4_;
          auVar86._16_4_ = fVar69 * fVar46;
          fVar70 = auVar52._20_4_;
          auVar86._20_4_ = fVar70 * fVar46;
          fVar71 = auVar52._24_4_;
          auVar86._24_4_ = fVar71 * fVar46;
          auVar86._28_4_ = 0;
          auVar59 = vfmadd213ps_fma(local_e20,auVar63,auVar86);
          auVar59 = vfmadd213ps_fma(_local_e40,auVar55,ZEXT1632(auVar59));
          auVar61 = ZEXT1632(CONCAT412(auVar59._12_4_ + auVar59._12_4_,
                                       CONCAT48(auVar59._8_4_ + auVar59._8_4_,
                                                CONCAT44(auVar59._4_4_ + auVar59._4_4_,
                                                         auVar59._0_4_ + auVar59._0_4_))));
          auVar93._0_4_ = fVar58 * fVar117;
          auVar93._4_4_ = fVar66 * fVar123;
          auVar93._8_4_ = fVar67 * fVar124;
          auVar93._12_4_ = fVar68 * fVar125;
          auVar93._16_4_ = fVar69 * fVar126;
          auVar93._20_4_ = fVar70 * fVar127;
          auVar93._24_4_ = fVar71 * fVar128;
          auVar93._28_4_ = 0;
          auVar59 = vfmadd213ps_fma(auVar54,auVar63,auVar93);
          auVar72 = vfmadd213ps_fma(auVar12,auVar55,ZEXT1632(auVar59));
          auVar52 = vrcpps_avx(auVar61);
          auVar133._8_4_ = 0x3f800000;
          auVar133._0_8_ = 0x3f8000003f800000;
          auVar133._12_4_ = 0x3f800000;
          auVar133._16_4_ = 0x3f800000;
          auVar133._20_4_ = 0x3f800000;
          auVar133._24_4_ = 0x3f800000;
          auVar133._28_4_ = 0x3f800000;
          auVar59 = vfnmadd213ps_fma(auVar52,auVar61,auVar133);
          auVar59 = vfmadd132ps_fma(ZEXT1632(auVar59),auVar52,auVar52);
          local_9a0 = ZEXT1632(CONCAT412(auVar59._12_4_ * (auVar72._12_4_ + auVar72._12_4_),
                                         CONCAT48(auVar59._8_4_ * (auVar72._8_4_ + auVar72._8_4_),
                                                  CONCAT44(auVar59._4_4_ *
                                                           (auVar72._4_4_ + auVar72._4_4_),
                                                           auVar59._0_4_ *
                                                           (auVar72._0_4_ + auVar72._0_4_)))));
          uVar38 = *(undefined4 *)(local_e50 + local_e58 * 4 + 0x60);
          auVar115._4_4_ = uVar38;
          auVar115._0_4_ = uVar38;
          auVar115._8_4_ = uVar38;
          auVar115._12_4_ = uVar38;
          auVar115._16_4_ = uVar38;
          auVar115._20_4_ = uVar38;
          auVar115._24_4_ = uVar38;
          auVar115._28_4_ = uVar38;
          uVar38 = *(undefined4 *)(local_e50 + local_e58 * 4 + 0x100);
          local_d40._4_4_ = uVar38;
          local_d40._0_4_ = uVar38;
          local_d40._8_4_ = uVar38;
          local_d40._12_4_ = uVar38;
          local_d40._16_4_ = uVar38;
          local_d40._20_4_ = uVar38;
          local_d40._24_4_ = uVar38;
          local_d40._28_4_ = uVar38;
          auVar101 = ZEXT3264(local_d40);
          auVar52 = vcmpps_avx(auVar115,local_9a0,2);
          auVar53 = vcmpps_avx(local_9a0,local_d40,2);
          auVar52 = vandps_avx(auVar53,auVar52);
          auVar59 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
          auVar48 = vpand_avx(auVar59,auVar48);
          auVar52 = vpmovsxwd_avx2(auVar48);
          if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar52 >> 0x7f,0) != '\0') ||
                (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar52 >> 0xbf,0) != '\0') ||
              (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar52[0x1f] < '\0') {
            auVar52 = vcmpps_avx(auVar61,_DAT_01f7b000,4);
            auVar59 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
            auVar48 = vpand_avx(auVar48,auVar59);
            local_a00 = vpmovsxwd_avx2(auVar48);
            if ((((((((local_a00 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_a00 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_a00 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_a00 >> 0x7f,0) != '\0') ||
                  (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(local_a00 >> 0xbf,0) != '\0') ||
                (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                local_a00[0x1f] < '\0') {
              local_a40 = local_d20;
              local_a20 = &local_e61;
              auVar52 = vsubps_avx(local_d20,auVar153);
              local_a80 = vblendvps_avx(local_ae0,auVar52,local_b00);
              auVar52 = vsubps_avx(local_d20,local_ae0);
              local_a60 = vblendvps_avx(auVar153,auVar52,local_b00);
              local_980[0] = auVar55._0_4_ * (float)local_b20._0_4_;
              local_980[1] = auVar55._4_4_ * (float)local_b20._4_4_;
              local_980[2] = auVar55._8_4_ * fStack_b18;
              local_980[3] = auVar55._12_4_ * fStack_b14;
              fStack_970 = auVar55._16_4_ * fStack_b10;
              fStack_96c = auVar55._20_4_ * fStack_b0c;
              fStack_968 = auVar55._24_4_ * fStack_b08;
              uStack_964 = local_b00._28_4_;
              local_960[0] = (float)local_b20._0_4_ * auVar63._0_4_;
              local_960[1] = (float)local_b20._4_4_ * auVar63._4_4_;
              local_960[2] = fStack_b18 * auVar63._8_4_;
              local_960[3] = fStack_b14 * auVar63._12_4_;
              fStack_950 = fStack_b10 * auVar63._16_4_;
              fStack_94c = fStack_b0c * auVar63._20_4_;
              fStack_948 = fStack_b08 * auVar63._24_4_;
              uStack_944 = auVar63._28_4_;
              local_940._4_4_ = (float)local_b20._4_4_ * fVar66;
              local_940._0_4_ = (float)local_b20._0_4_ * fVar58;
              local_940._8_4_ = fStack_b18 * fVar67;
              local_940._12_4_ = fStack_b14 * fVar68;
              local_940._16_4_ = fStack_b10 * fVar69;
              local_940._20_4_ = fStack_b0c * fVar70;
              local_940._24_4_ = fStack_b08 * fVar71;
              local_940._28_4_ = auVar63._28_4_;
              pGVar40 = (local_d70->geometries).items[local_de8].ptr;
              if ((pGVar40->mask & *(uint *)(local_e50 + local_e58 * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar40->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01628d70:
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                  goto LAB_01628d8c;
                }
                auVar57._0_8_ = (ulong)CONCAT24(uVar2,(uint)uVar2) & 0x7fff00007fff;
                auVar57._8_4_ = local_e44;
                auVar57._12_4_ = local_e44;
                auVar57._16_4_ = local_e44;
                auVar57._20_4_ = local_e44;
                auVar57._24_4_ = local_e44;
                auVar57._28_4_ = local_e44;
                auVar52 = vpaddd_avx2(auVar57,_DAT_01fb7740);
                auVar65._0_8_ =
                     (ulong)(CONCAT24(uVar3,(uint)uVar3) & 0xffff00007fff) & 0x7fffffffffff;
                auVar65._8_4_ = local_e48;
                auVar65._12_4_ = local_e48;
                auVar65._16_4_ = local_e48;
                auVar65._20_4_ = local_e48;
                auVar65._24_4_ = local_e48;
                auVar65._28_4_ = local_e48;
                auVar61 = vpaddd_avx2(auVar65,_DAT_01fb7760);
                auVar98._0_4_ = (float)(int)(*(ushort *)(local_d78 + 8 + local_d80) - 1);
                auVar98._4_12_ = auVar10._4_12_;
                auVar59 = vrcpss_avx(auVar98,auVar98);
                auVar111._0_4_ = (float)(int)(*(ushort *)(local_d78 + 10 + local_d80) - 1);
                auVar111._4_12_ = auVar10._4_12_;
                auVar72 = vfnmadd213ss_fma(auVar98,auVar59,SUB6416(ZEXT464(0x40000000),0));
                fVar46 = auVar59._0_4_ * auVar72._0_4_;
                auVar59 = vrcpss_avx(auVar111,auVar111);
                auVar72 = vfnmadd213ss_fma(auVar111,auVar59,SUB6416(ZEXT464(0x40000000),0));
                fVar58 = auVar59._0_4_ * auVar72._0_4_;
                auVar53 = vcvtdq2ps_avx(auVar52);
                auVar61 = vcvtdq2ps_avx(auVar61);
                auVar52 = vrcpps_avx(local_d20);
                auVar94._8_4_ = 0x3f800000;
                auVar94._0_8_ = 0x3f8000003f800000;
                auVar94._12_4_ = 0x3f800000;
                auVar94._16_4_ = 0x3f800000;
                auVar94._20_4_ = 0x3f800000;
                auVar94._24_4_ = 0x3f800000;
                auVar94._28_4_ = 0x3f800000;
                auVar59 = vfnmadd213ps_fma(local_d20,auVar52,auVar94);
                auVar59 = vfmadd132ps_fma(ZEXT1632(auVar59),auVar52,auVar52);
                auVar77._8_4_ = 0x219392ef;
                auVar77._0_8_ = 0x219392ef219392ef;
                auVar77._12_4_ = 0x219392ef;
                auVar77._16_4_ = 0x219392ef;
                auVar77._20_4_ = 0x219392ef;
                auVar77._24_4_ = 0x219392ef;
                auVar77._28_4_ = 0x219392ef;
                auVar52 = vcmpps_avx(local_b40,auVar77,5);
                auVar52 = vandps_avx(ZEXT1632(auVar59),auVar52);
                auVar27._4_4_ = (fVar158 * auVar53._4_4_ + local_a80._4_4_) * fVar46 * auVar52._4_4_
                ;
                auVar27._0_4_ = (fVar154 * auVar53._0_4_ + local_a80._0_4_) * fVar46 * auVar52._0_4_
                ;
                auVar27._8_4_ = (fVar159 * auVar53._8_4_ + local_a80._8_4_) * fVar46 * auVar52._8_4_
                ;
                auVar27._12_4_ =
                     (fVar160 * auVar53._12_4_ + local_a80._12_4_) * fVar46 * auVar52._12_4_;
                auVar27._16_4_ = (auVar53._16_4_ * 0.0 + local_a80._16_4_) * fVar46 * auVar52._16_4_
                ;
                auVar27._20_4_ = (auVar53._20_4_ * 0.0 + local_a80._20_4_) * fVar46 * auVar52._20_4_
                ;
                auVar27._24_4_ = (auVar53._24_4_ * 0.0 + local_a80._24_4_) * fVar46 * auVar52._24_4_
                ;
                auVar27._28_4_ = auVar53._28_4_ + local_a80._28_4_;
                local_9e0 = vminps_avx(auVar27,auVar94);
                auVar28._4_4_ = (fVar158 * auVar61._4_4_ + local_a60._4_4_) * fVar58 * auVar52._4_4_
                ;
                auVar28._0_4_ = (fVar154 * auVar61._0_4_ + local_a60._0_4_) * fVar58 * auVar52._0_4_
                ;
                auVar28._8_4_ = (fVar159 * auVar61._8_4_ + local_a60._8_4_) * fVar58 * auVar52._8_4_
                ;
                auVar28._12_4_ =
                     (fVar160 * auVar61._12_4_ + local_a60._12_4_) * fVar58 * auVar52._12_4_;
                auVar28._16_4_ = (auVar61._16_4_ * 0.0 + local_a60._16_4_) * fVar58 * auVar52._16_4_
                ;
                auVar28._20_4_ = (auVar61._20_4_ * 0.0 + local_a60._20_4_) * fVar58 * auVar52._20_4_
                ;
                auVar28._24_4_ = (auVar61._24_4_ * 0.0 + local_a60._24_4_) * fVar58 * auVar52._24_4_
                ;
                auVar28._28_4_ = local_9e0._28_4_;
                local_9c0 = vminps_avx(auVar28,auVar94);
                auVar48 = vpacksswb_avx(auVar48,auVar48);
                uVar42 = 0;
                uVar39 = (ulong)(byte)(SUB161(auVar48 >> 7,0) & 1 |
                                       (SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar48 >> 0x3f,0) << 7);
                for (uVar31 = uVar39; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000)
                {
                  uVar42 = uVar42 + 1;
                }
                local_de0._0_4_ = local_de0._4_4_;
                uStack_dd8._0_4_ = local_de0._4_4_;
                uStack_dd8._4_4_ = local_de0._4_4_;
                uStack_dd0._0_4_ = local_de0._4_4_;
                uStack_dd0._4_4_ = local_de0._4_4_;
                uStack_dc8._0_4_ = local_de0._4_4_;
                uStack_dc8._4_4_ = local_de0._4_4_;
                local_ce0._4_4_ = uVar34;
                local_ce0._0_4_ = uVar34;
                local_ce0._8_4_ = uVar34;
                local_ce0._12_4_ = uVar34;
                local_ce0._16_4_ = uVar34;
                local_ce0._20_4_ = uVar34;
                local_ce0._24_4_ = uVar34;
                local_ce0._28_4_ = uVar34;
                auStack_d58 = auVar62._8_24_;
                local_d60 = pGVar40;
                while (uVar39 != 0) {
                  local_8c0 = *(undefined4 *)(local_9e0 + uVar42 * 4);
                  local_8a0 = *(undefined4 *)(local_9c0 + uVar42 * 4);
                  *(float *)(ray + k * 4 + 0x100) = local_980[uVar42 - 8];
                  fVar46 = local_980[uVar42];
                  auVar78._4_4_ = fVar46;
                  auVar78._0_4_ = fVar46;
                  auVar78._8_4_ = fVar46;
                  auVar78._12_4_ = fVar46;
                  auVar78._16_4_ = fVar46;
                  auVar78._20_4_ = fVar46;
                  auVar78._24_4_ = fVar46;
                  auVar78._28_4_ = fVar46;
                  fVar58 = local_960[uVar42];
                  local_900._4_4_ = fVar58;
                  local_900._0_4_ = fVar58;
                  local_900._8_4_ = fVar58;
                  local_900._12_4_ = fVar58;
                  local_900._16_4_ = fVar58;
                  local_900._20_4_ = fVar58;
                  local_900._24_4_ = fVar58;
                  local_900._28_4_ = fVar58;
                  uVar38 = *(undefined4 *)(local_940 + uVar42 * 4);
                  local_8e0._4_4_ = uVar38;
                  local_8e0._0_4_ = uVar38;
                  local_8e0._8_4_ = uVar38;
                  local_8e0._12_4_ = uVar38;
                  local_8e0._16_4_ = uVar38;
                  local_8e0._20_4_ = uVar38;
                  local_8e0._24_4_ = uVar38;
                  local_8e0._28_4_ = uVar38;
                  local_c10.context = context->user;
                  local_920[0] = (RTCHitN)SUB41(fVar46,0);
                  local_920[1] = (RTCHitN)(char)((uint)fVar46 >> 8);
                  local_920[2] = (RTCHitN)(char)((uint)fVar46 >> 0x10);
                  local_920[3] = (RTCHitN)(char)((uint)fVar46 >> 0x18);
                  local_920[4] = (RTCHitN)SUB41(fVar46,0);
                  local_920[5] = (RTCHitN)(char)((uint)fVar46 >> 8);
                  local_920[6] = (RTCHitN)(char)((uint)fVar46 >> 0x10);
                  local_920[7] = (RTCHitN)(char)((uint)fVar46 >> 0x18);
                  local_920[8] = (RTCHitN)SUB41(fVar46,0);
                  local_920[9] = (RTCHitN)(char)((uint)fVar46 >> 8);
                  local_920[10] = (RTCHitN)(char)((uint)fVar46 >> 0x10);
                  local_920[0xb] = (RTCHitN)(char)((uint)fVar46 >> 0x18);
                  local_920[0xc] = (RTCHitN)SUB41(fVar46,0);
                  local_920[0xd] = (RTCHitN)(char)((uint)fVar46 >> 8);
                  local_920[0xe] = (RTCHitN)(char)((uint)fVar46 >> 0x10);
                  local_920[0xf] = (RTCHitN)(char)((uint)fVar46 >> 0x18);
                  local_920[0x10] = (RTCHitN)SUB41(fVar46,0);
                  local_920[0x11] = (RTCHitN)(char)((uint)fVar46 >> 8);
                  local_920[0x12] = (RTCHitN)(char)((uint)fVar46 >> 0x10);
                  local_920[0x13] = (RTCHitN)(char)((uint)fVar46 >> 0x18);
                  local_920[0x14] = (RTCHitN)SUB41(fVar46,0);
                  local_920[0x15] = (RTCHitN)(char)((uint)fVar46 >> 8);
                  local_920[0x16] = (RTCHitN)(char)((uint)fVar46 >> 0x10);
                  local_920[0x17] = (RTCHitN)(char)((uint)fVar46 >> 0x18);
                  local_920[0x18] = (RTCHitN)SUB41(fVar46,0);
                  local_920[0x19] = (RTCHitN)(char)((uint)fVar46 >> 8);
                  local_920[0x1a] = (RTCHitN)(char)((uint)fVar46 >> 0x10);
                  local_920[0x1b] = (RTCHitN)(char)((uint)fVar46 >> 0x18);
                  local_920[0x1c] = (RTCHitN)SUB41(fVar46,0);
                  local_920[0x1d] = (RTCHitN)(char)((uint)fVar46 >> 8);
                  local_920[0x1e] = (RTCHitN)(char)((uint)fVar46 >> 0x10);
                  local_920[0x1f] = (RTCHitN)(char)((uint)fVar46 >> 0x18);
                  uStack_8bc = local_8c0;
                  uStack_8b8 = local_8c0;
                  uStack_8b4 = local_8c0;
                  uStack_8b0 = local_8c0;
                  uStack_8ac = local_8c0;
                  uStack_8a8 = local_8c0;
                  uStack_8a4 = local_8c0;
                  uStack_89c = local_8a0;
                  uStack_898 = local_8a0;
                  uStack_894 = local_8a0;
                  uStack_890 = local_8a0;
                  uStack_88c = local_8a0;
                  uStack_888 = local_8a0;
                  uStack_884 = local_8a0;
                  local_880 = local_ce0._0_8_;
                  uStack_878 = local_ce0._8_8_;
                  uStack_870 = local_ce0._16_8_;
                  uStack_868 = local_ce0._24_8_;
                  local_860 = local_de0;
                  uStack_858 = uStack_dd8;
                  uStack_850 = uStack_dd0;
                  uStack_848 = uStack_dc8;
                  auVar52 = vpcmpeqd_avx2(auVar78,auVar78);
                  uStack_83c = (local_c10.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_c10.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_b80 = local_b60;
                  local_c10.valid = (int *)local_b80;
                  local_c10.geometryUserPtr = pGVar40->userPtr;
                  local_c10.hit = local_920;
                  local_c10.N = 8;
                  auVar41 = (undefined1  [8])uVar42;
                  local_c10.ray = (RTCRayN *)ray;
                  if (pGVar40->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_e20._0_8_ = uVar39;
                    local_e40 = (undefined1  [8])uVar42;
                    auVar52 = ZEXT1632(auVar52._0_16_);
                    (*pGVar40->occlusionFilterN)(&local_c10);
                    auVar101 = ZEXT3264(local_d40);
                    auVar52 = vpcmpeqd_avx2(auVar52,auVar52);
                    k = local_e58;
                    uVar39 = local_e20._0_8_;
                    pGVar40 = local_d60;
                    auVar41 = local_e40;
                    ray = local_e50;
                  }
                  auVar61 = vpcmpeqd_avx2(local_b80,_DAT_01f7b000);
                  auVar53 = auVar52 & ~auVar61;
                  if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar53 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar53 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar53 >> 0x7f,0) == '\0') &&
                        (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar53 >> 0xbf,0) == '\0') &&
                      (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar53[0x1f]) {
                    auVar61 = auVar61 ^ auVar52;
                  }
                  else {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar40->field_8).field_0x2 & 0x40) != 0)))) {
                      local_e20._0_8_ = uVar39;
                      local_e40 = auVar41;
                      auVar52 = ZEXT1632(auVar52._0_16_);
                      (*p_Var9)(&local_c10);
                      auVar101 = ZEXT3264(local_d40);
                      auVar52 = vpcmpeqd_avx2(auVar52,auVar52);
                      k = local_e58;
                      uVar39 = local_e20._0_8_;
                      pGVar40 = local_d60;
                      auVar41 = local_e40;
                      ray = local_e50;
                    }
                    auVar53 = vpcmpeqd_avx2(local_b80,_DAT_01f7b000);
                    auVar61 = auVar53 ^ auVar52;
                    auVar79._8_4_ = 0xff800000;
                    auVar79._0_8_ = 0xff800000ff800000;
                    auVar79._12_4_ = 0xff800000;
                    auVar79._16_4_ = 0xff800000;
                    auVar79._20_4_ = 0xff800000;
                    auVar79._24_4_ = 0xff800000;
                    auVar79._28_4_ = 0xff800000;
                    auVar52 = vblendvps_avx(auVar79,*(undefined1 (*) [32])(local_c10.ray + 0x100),
                                            auVar53);
                    *(undefined1 (*) [32])(local_c10.ray + 0x100) = auVar52;
                  }
                  if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar61 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar61 >> 0x7f,0) != '\0') ||
                        (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar61 >> 0xbf,0) != '\0') ||
                      (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar61[0x1f] < '\0') goto LAB_01628d70;
                  *(int *)(ray + k * 4 + 0x100) = auVar101._0_4_;
                  uVar42 = 0;
                  uVar39 = uVar39 ^ 1L << ((ulong)auVar41 & 0x3f);
                  for (uVar31 = uVar39; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000
                      ) {
                    uVar42 = uVar42 + 1;
                  }
                }
              }
            }
          }
        }
        local_d88 = local_d88 - 1 & local_d88;
        uVar42 = local_da8;
      }
      auVar101 = ZEXT1664(local_ca0);
      auVar108 = ZEXT1664(local_cb0);
      bvh = (BVH *)0x0;
      fVar67 = local_cc0;
      fVar70 = fStack_cbc;
      fVar71 = fStack_cb8;
      fVar116 = fStack_cb4;
      fVar68 = local_c30;
      fVar134 = fStack_c2c;
      fVar136 = fStack_c28;
      fVar138 = fStack_c24;
      fVar69 = local_c40;
      fVar146 = fStack_c3c;
      fVar147 = fStack_c38;
      fVar148 = fStack_c34;
      fVar46 = local_c50;
      fVar117 = fStack_c4c;
      fVar123 = fStack_c48;
      fVar124 = fStack_c44;
      fVar58 = local_c60;
      fVar125 = fStack_c5c;
      fVar126 = fStack_c58;
      fVar127 = fStack_c54;
      fVar66 = local_c70;
      fVar128 = fStack_c6c;
      fVar129 = fStack_c68;
      fVar135 = fStack_c64;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }